

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf64.c
# Opt level: O2

void elf64_symbols(GlobalVars *gv,Elf64_Ehdr *ehdr,ObjectUnit *ou,Elf64_Shdr *shdr)

{
  byte bVar1;
  LinkFile *lf;
  char *pcVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint32_t shtype;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong uVar8;
  char *pcVar9;
  uint64_t size;
  uint be;
  uchar *p;
  uint8_t *symname;
  
  lf = ou->lnkfile;
  be = (uint)(ehdr->e_ident[5] == '\x02');
  uVar5 = read64(be,shdr->sh_offset);
  uVar6 = read64(be,shdr->sh_entsize);
  uVar7 = read64(be,shdr->sh_size);
  uVar4 = read32(be,shdr->sh_link);
  pcVar9 = elf64_strtab(lf,ehdr,uVar4);
  size = read64(be,shdr->sh_size);
  elf_check_offset(lf,"symbol",ehdr->e_ident + uVar5,size);
  p = ehdr->e_type + uVar5 + uVar6;
  for (uVar8 = uVar7 / uVar6; 1 < (int)uVar8; uVar8 = (ulong)((int)uVar8 - 1)) {
    uVar4 = read32(be,(Elf64_Ehdr *)(p + -0x10));
    symname = (uint8_t *)(pcVar9 + uVar4);
    if ((symname < lf->data) || (lf->data + lf->length < symname)) {
      pcVar2 = lf->pathname;
      uVar4 = read32(be,(Elf64_Ehdr *)(p + -0x10));
      error(0x7f,pcVar2,(ulong)uVar4,lf->objname);
    }
    uVar4 = read32(be,shdr->sh_type);
    uVar3 = read16(be,p + -10);
    shtype = read32(be,shdr->sh_type);
    bVar1 = p[-0xc];
    uVar5 = read64(be,p + -8);
    uVar7 = read64(be,p);
    elf_add_symbol(gv,ou,(char *)symname,(uVar4 == 0xb) << 4,(uint)uVar3,shtype,bVar1 & 0xf,
                   bVar1 >> 4,uVar5,(uint32_t)uVar7);
    p = p + uVar6;
  }
  return;
}

Assistant:

static void elf64_symbols(struct GlobalVars *gv,struct Elf64_Ehdr *ehdr,
                   struct ObjectUnit *ou,struct Elf64_Shdr *shdr)
/* convert ELF symbol definitions into internal format */
{
  bool be = (ehdr->e_ident[EI_DATA] == ELFDATA2MSB);
  struct LinkFile *lf = ou->lnkfile;
  uint8_t *data = (uint8_t *)ehdr + read64(be,shdr->sh_offset);
  unsigned long entsize = read64(be,shdr->sh_entsize);
  int nsyms = (int)(read64(be,shdr->sh_size) / (uint64_t)entsize);
  char *strtab = elf64_strtab(lf,ehdr,read32(be,shdr->sh_link));

  elf_check_offset(lf,"symbol",data,read64(be,shdr->sh_size));

  /* read ELF xdef symbols and convert to internal format */
  while (--nsyms > 0) {
    struct Elf64_Sym *elfsym;
    char *symname;

    elfsym = (struct Elf64_Sym *)(data += entsize);
    symname = strtab + read32(be,elfsym->st_name);
    if (symname<(char *)lf->data || symname>(char *)lf->data+lf->length)
      error(127,lf->pathname,read32(be,elfsym->st_name),lf->objname);

    elf_add_symbol(gv,ou,symname,
                   (read32(be,shdr->sh_type)==SHT_DYNSYM) ? SYMF_SHLIB : 0,
                   read16(be,elfsym->st_shndx),
                   read32(be,shdr->sh_type),
                   ELF64_ST_TYPE(*elfsym->st_info),
                   ELF64_ST_BIND(*elfsym->st_info),
                   read64(be,elfsym->st_value),
                   read64(be,elfsym->st_size));
  }
}